

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateEquals
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldGenerator *pFVar2;
  OneofDescriptor *extraout_RDX;
  OneofDescriptor *extraout_RDX_00;
  OneofDescriptor *extraout_RDX_01;
  OneofDescriptor *oneof;
  long lVar3;
  char *text;
  long lVar4;
  string local_50;
  
  if ((*(int *)(this->descriptor_ + 0x2c) != 0) || (this->params_->store_unknown_fields_ == true)) {
    io::Printer::Print(printer,"\n@Override\npublic boolean equals(Object o) {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "if (o == this) {\n  return true;\n}\nif (!(o instanceof $classname$)) {\n  return false;\n}\n$classname$ other = ($classname$) o;\n"
                       ,"classname",*(string **)this->descriptor_);
    pDVar1 = this->descriptor_;
    if (0 < *(int *)(pDVar1 + 0x38)) {
      lVar3 = 0;
      lVar4 = 0;
      oneof = extraout_RDX;
      do {
        UnderscoresToCamelCase_abi_cxx11_
                  (&local_50,(javanano *)(*(long *)(pDVar1 + 0x40) + lVar3),oneof);
        io::Printer::Print(printer,
                           "if (this.$oneof_name$Case_ != other.$oneof_name$Case_) {\n  return false;\n}\n"
                           ,"oneof_name",&local_50);
        oneof = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          oneof = extraout_RDX_01;
        }
        lVar4 = lVar4 + 1;
        pDVar1 = this->descriptor_;
        lVar3 = lVar3 + 0x30;
      } while (lVar4 < *(int *)(pDVar1 + 0x38));
    }
    pDVar1 = this->descriptor_;
    if (0 < *(int *)(pDVar1 + 0x2c)) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        pFVar2 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3));
        (*pFVar2->_vptr_FieldGenerator[10])(pFVar2,printer);
        lVar4 = lVar4 + 1;
        pDVar1 = this->descriptor_;
        lVar3 = lVar3 + 0xa8;
      } while (lVar4 < *(int *)(pDVar1 + 0x2c));
    }
    text = "return true;\n";
    if (this->params_->store_unknown_fields_ != false) {
      text = 
      "if (unknownFieldData == null || unknownFieldData.isEmpty()) {\n  return other.unknownFieldData == null || other.unknownFieldData.isEmpty();\n} else {\n  return unknownFieldData.equals(other.unknownFieldData);\n}"
      ;
    }
    io::Printer::Print(printer,text);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateEquals(io::Printer* printer) {
  // Don't override if there are no fields. We could generate an
  // equals method that compares types, but often empty messages
  // are used as namespaces.
  if (descriptor_->field_count() == 0 && !params_.store_unknown_fields()) {
    return;
  }

  printer->Print(
    "\n"
    "@Override\n"
    "public boolean equals(Object o) {\n");
  printer->Indent();
  printer->Print(
    "if (o == this) {\n"
    "  return true;\n"
    "}\n"
    "if (!(o instanceof $classname$)) {\n"
    "  return false;\n"
    "}\n"
    "$classname$ other = ($classname$) o;\n",
    "classname", descriptor_->name());

  // Checking oneof case before checking each oneof field.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof_desc = descriptor_->oneof_decl(i);
    printer->Print(
      "if (this.$oneof_name$Case_ != other.$oneof_name$Case_) {\n"
      "  return false;\n"
      "}\n",
      "oneof_name", UnderscoresToCamelCase(oneof_desc));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    field_generators_.get(field).GenerateEqualsCode(printer);
  }

  if (params_.store_unknown_fields()) {
    printer->Print(
      "if (unknownFieldData == null || unknownFieldData.isEmpty()) {\n"
      "  return other.unknownFieldData == null || other.unknownFieldData.isEmpty();\n"
      "} else {\n"
      "  return unknownFieldData.equals(other.unknownFieldData);\n"
      "}");
  } else {
    printer->Print(
      "return true;\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}